

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int magma_cipher_init_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  long lVar2;
  EVP_MD_CTX *omac_ctx;
  uchar cipher_key [32];
  uchar auStack_48 [32];
  
  if (key == (uchar *)0x0) {
    iVar1 = magma_cipher_init(ctx,(uchar *)0x0,iv,enc);
    return iVar1;
  }
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(ctx);
  omac_ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  *(EVP_MD_CTX **)(lVar2 + 0x1080) = omac_ctx;
  if (omac_ctx == (EVP_MD_CTX *)0x0) {
    ERR_GOST_error(0xa5,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                   ,0x217);
  }
  else {
    iVar1 = gost2015_acpkm_omac_init(0x4a8,enc,key,omac_ctx,auStack_48,(uchar *)(lVar2 + 0xc));
    if (iVar1 == 1) {
      iVar1 = magma_cipher_init(ctx,auStack_48,iv,enc);
      return iVar1;
    }
    EVP_MD_CTX_free(*(undefined8 *)(lVar2 + 0x1080));
    *(undefined8 *)(lVar2 + 0x1080) = 0;
  }
  return 0;
}

Assistant:

static int magma_cipher_init_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                      const unsigned char *iv, int enc)
{
	if (key) {
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
		unsigned char cipher_key[32];
		c->omac_ctx = EVP_MD_CTX_new();

		if (c->omac_ctx == NULL) {
		    GOSTerr(GOST_F_MAGMA_CIPHER_INIT_CTR_ACPKM_OMAC, ERR_R_MALLOC_FAILURE);
				return 0;
		}

		if (gost2015_acpkm_omac_init(NID_magma_mac, enc, key,
		                 c->omac_ctx, cipher_key, c->kdf_seed) != 1) {
		    EVP_MD_CTX_free(c->omac_ctx);
				c->omac_ctx = NULL;
		    return 0;
		}

		return magma_cipher_init(ctx, cipher_key, iv, enc);
	}

	return magma_cipher_init(ctx, key, iv, enc);
}